

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O0

matrix4 * matrix4_scalev3(matrix4 *self,vector3 *scale)

{
  matrix4 *pmVar1;
  undefined1 local_58 [8];
  matrix4 scalingMatrix;
  vector3 *scale_local;
  matrix4 *self_local;
  
  scalingMatrix.field_0._56_8_ = scale;
  pmVar1 = matrix4_make_transformation_scalingv3((matrix4 *)local_58,scale);
  pmVar1 = matrix4_multiply(self,pmVar1);
  return pmVar1;
}

Assistant:

HYPAPI struct matrix4 *matrix4_scalev3(struct matrix4 *self, const struct vector3 *scale)
{
	struct matrix4 scalingMatrix;

	return matrix4_multiply(self,
		matrix4_make_transformation_scalingv3(&scalingMatrix, scale));
}